

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

int Gia_ManSuppSizeTest(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int level;
  Gia_Obj_t *pObj;
  long lVar4;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar1 = p->nObjs;
  uVar3 = 0;
  if ((0 < iVar1) && (pObj = p->pObjs, uVar3 = 0, pObj != (Gia_Obj_t *)0x0)) {
    uVar3 = 0;
    lVar4 = 0;
    do {
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        Gia_ManIncrementTravId(p);
        iVar1 = Gia_ManSuppSize_rec(p,pObj);
        uVar3 = uVar3 + (iVar1 < 0x11);
      }
      lVar4 = lVar4 + 1;
      iVar1 = p->nObjs;
    } while ((lVar4 < iVar1) && (pObj = p->pObjs + lVar4, p->pObjs != (Gia_Obj_t *)0x0));
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar3,
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + iVar1));
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar2) / 1000000.0);
  return uVar3;
}

Assistant:

int Gia_ManSuppSizeTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            Counter += (Gia_ManSuppSizeOne(p, pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Gia_ManAndNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}